

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_fyl2xp1_x86_64(CPUX86State *env)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  floatx80 fVar5;
  floatx80 a;
  undefined6 uStack_1e;
  double fptemp;
  CPUX86State *env_local;
  
  fVar5._10_6_ = 0;
  fVar5._0_10_ = *(unkuint10 *)(env->fpregs + env->fpstt);
  dVar2 = floatx80_to_double(env,fVar5);
  if (dVar2 + 1.0 <= 0.0) {
    env->fpus = env->fpus & 0xb8ff;
    env->fpus = env->fpus | 0x400;
  }
  else {
    dVar2 = log(dVar2 + 1.0);
    dVar3 = log(2.0);
    a._10_6_ = 0;
    a._0_10_ = *(unkuint10 *)(env->fpregs + (env->fpstt + 1 & 7));
    dVar4 = floatx80_to_double(env,a);
    uVar1 = env->fpstt;
    fVar5 = double_to_floatx80(env,dVar4 * (dVar2 / dVar3));
    env->fpregs[uVar1 + 1 & 7].d.low = fVar5.low;
    *(ulong *)((long)(env->fpregs + (uVar1 + 1 & 7)) + 8) = CONCAT62(uStack_1e,fVar5.high);
    fpop(env);
  }
  return;
}

Assistant:

void helper_fyl2xp1(CPUX86State *env)
{
    double fptemp = floatx80_to_double(env, ST0);

    if ((fptemp + 1.0) > 0.0) {
        fptemp = log(fptemp + 1.0) / log(2.0); /* log2(ST + 1.0) */
        fptemp *= floatx80_to_double(env, ST1);
        ST1 = double_to_floatx80(env, fptemp);
        fpop(env);
    } else {
        env->fpus &= ~0x4700;
        env->fpus |= 0x400;
    }
}